

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_resolver_results.hpp
# Opt level: O2

const_iterator * __thiscall
webfront::http::std::experimental::net::v1::ip::
basic_resolver_results<std::experimental::net::v1::ip::tcp>::begin
          (const_iterator *__return_storage_ptr__,
          basic_resolver_results<std::experimental::net::v1::ip::tcp> *this)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  basic_resolver_iterator<std::experimental::net::v1::ip::tcp> local_28;
  
  basic_resolver_iterator<std::experimental::net::v1::ip::tcp>::basic_resolver_iterator
            (&local_28,&this->super_basic_resolver_iterator<std::experimental::net::v1::ip::tcp>);
  _Var2._M_pi = local_28.values_.
                super___shared_ptr<std::vector<std::experimental::net::v1::ip::basic_resolver_entry<std::experimental::net::v1::ip::tcp>,_std::allocator<std::experimental::net::v1::ip::basic_resolver_entry<std::experimental::net::v1::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  peVar1 = local_28.values_.
           super___shared_ptr<std::vector<std::experimental::net::v1::ip::basic_resolver_entry<std::experimental::net::v1::ip::tcp>,_std::allocator<std::experimental::net::v1::ip::basic_resolver_entry<std::experimental::net::v1::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_28.values_.
  super___shared_ptr<std::vector<std::experimental::net::v1::ip::basic_resolver_entry<std::experimental::net::v1::ip::tcp>,_std::allocator<std::experimental::net::v1::ip::basic_resolver_entry<std::experimental::net::v1::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_28.values_.
  super___shared_ptr<std::vector<std::experimental::net::v1::ip::basic_resolver_entry<std::experimental::net::v1::ip::tcp>,_std::allocator<std::experimental::net::v1::ip::basic_resolver_entry<std::experimental::net::v1::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->values_).
  super___shared_ptr<std::vector<std::experimental::net::v1::ip::basic_resolver_entry<std::experimental::net::v1::ip::tcp>,_std::allocator<std::experimental::net::v1::ip::basic_resolver_entry<std::experimental::net::v1::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar1;
  (__return_storage_ptr__->values_).
  super___shared_ptr<std::vector<std::experimental::net::v1::ip::basic_resolver_entry<std::experimental::net::v1::ip::tcp>,_std::allocator<std::experimental::net::v1::ip::basic_resolver_entry<std::experimental::net::v1::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var2._M_pi;
  __return_storage_ptr__->index_ = 0;
  local_28.index_ = 0;
  __shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.values_.
              super___shared_ptr<std::vector<std::experimental::net::v1::ip::basic_resolver_entry<std::experimental::net::v1::ip::tcp>,_std::allocator<std::experimental::net::v1::ip::basic_resolver_entry<std::experimental::net::v1::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

const_iterator begin() const
  {
    basic_resolver_results tmp(*this);
    tmp.index_ = 0;
    return NET_TS_MOVE_CAST(basic_resolver_results)(tmp);
  }